

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QTextCharFormat>::moveAppend
          (QGenericArrayOps<QTextCharFormat> *this,QTextCharFormat *b,QTextCharFormat *e)

{
  QTextCharFormat *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QTextCharFormat *in_RDI;
  QTextCharFormat *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QTextCharFormat>::begin
                        ((QArrayDataPointer<QTextCharFormat> *)0x79ef67);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QTextCharFormat::QTextCharFormat(this_00,in_RDI);
      local_10 = local_10 + 0x10;
      in_RDI[1].super_QTextFormat.d.d.ptr =
           (QTextFormatPrivate *)
           ((long)&((in_RDI[1].super_QTextFormat.d.d.ptr)->super_QSharedData).ref.
                   super_QAtomicInteger<int>.super_QBasicAtomicInteger<int> + 1);
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }